

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void hash_table_increase_buckets(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  undefined8 *puVar3;
  int iVar4;
  hash_table_bucket_t *phVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  hash_table_bucket_t *phVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  
  uVar1 = table->n_buckets;
  uVar8 = (ulong)uVar1;
  if (uVar1 == 0) {
    __assert_fail("table->n_buckets > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                  ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
  }
  uVar10 = (ulong)(uVar1 * 2 + 1);
  uVar13 = 0x10;
  phVar5 = (hash_table_bucket_t *)calloc(uVar10,0x10);
  if (phVar5 == (hash_table_bucket_t *)0x0) {
    hash_table_increase_buckets_cold_1();
    lVar6 = *(long *)(uVar10 + 0x38);
    lVar9 = (**(code **)(uVar10 + 0x28))(uVar13);
    puVar3 = *(undefined8 **)
              (*(long *)(uVar10 + 8) + 8 +
              ((ulong)(lVar9 * lVar6 + *(long *)(uVar10 + 0x40)) >>
               (-*(char *)(uVar10 + 0x48) & 0x3fU) & 0xffffffff) * 0x10);
    while ((puVar3 != (undefined8 *)0x0 &&
           (iVar4 = (**(code **)(uVar10 + 0x20))(uVar13,*puVar3), iVar4 == 0))) {
      puVar3 = (undefined8 *)puVar3[1];
    }
    return;
  }
  phVar5->next = table->allocs;
  table->allocs = phVar5;
  lVar6 = table->seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar16._0_8_ = lVar6;
  auVar16._12_4_ = 0x45300000;
  dVar17 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 5.421010862427522e-20 *
           1.8446744073709552e+19;
  uVar14 = (ulong)dVar17;
  uVar14 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
  sVar7 = lVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  auVar18._8_4_ = (int)(sVar7 >> 0x20);
  auVar18._0_8_ = sVar7;
  auVar18._12_4_ = 0x45300000;
  dVar17 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) * 5.421010862427522e-20 *
           1.8446744073709552e+19;
  uVar10 = (ulong)dVar17;
  table->seed = sVar7;
  uVar10 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
  iVar4 = uint32_log2(uVar1 * 2);
  uVar11 = 0;
  do {
    phVar12 = table->buckets[uVar11].next;
    if (phVar12 != (hash_table_bucket_t *)0x0) {
      do {
        phVar2 = phVar12->next;
        sVar7 = (*table->hash)(phVar12->data);
        uVar8 = sVar7 * uVar14 + uVar10 >> (0x40U - (char)iVar4 & 0x3f) & 0xffffffff;
        phVar12->next = phVar5[uVar8 + 1].next;
        phVar5[uVar8 + 1].next = phVar12;
        phVar12 = phVar2;
      } while (phVar2 != (hash_table_bucket_t *)0x0);
      uVar8 = (ulong)table->n_buckets;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 < uVar8);
  phVar12 = table->buckets;
  uVar15 = (int)uVar8 - 1;
  if (uVar15 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)uVar15;
    uVar11 = uVar8;
    phVar2 = phVar12;
    do {
      phVar2->next = phVar2 + 1;
      phVar2->data = (void *)0x0;
      uVar11 = uVar11 - 1;
      phVar2 = phVar2 + 1;
    } while (uVar11 != 0);
  }
  phVar12[uVar8].next = table->free_buckets;
  phVar12[uVar8].data = (void *)0x0;
  table->free_buckets = phVar12;
  table->buckets = phVar5 + 1;
  table->n_buckets = uVar1 * 2;
  (table->ghash).mult = uVar14;
  (table->ghash).add = uVar10;
  (table->ghash).log2_buckets = iVar4;
  return;
}

Assistant:

static void hash_table_increase_buckets( hash_table_t * table )
{
    unsigned i, j, new_n_buckets ;
    hash_table_bucket_t * new_table ;
    universal_hash_function_t new_ghash;
    assert( table->n_buckets > 0 );
    
    new_table = calloc(table->n_buckets * 2 + 1, sizeof(hash_table_bucket_t));
    if (!new_table) {
        fprintf(stderr, "hash_table_increase_buckets: "
                "insufficient memory\n");
        abort();
    }
    new_table->next = table->allocs;
    table->allocs = new_table;
    new_table += 1;

    new_n_buckets = 2 * table->n_buckets;
    new_ghash = new_universal_hash_function(&table->seed, new_n_buckets);
    
    /* rehash existing items*/
    for ( i = 0; i < table->n_buckets ; ++i ) {
        hash_table_bucket_t * b = table->buckets[i].next;
        while (b) {
            hash_table_bucket_t * c = b->next;
            j = (unsigned) hash( new_ghash, (* table->hash )( b->data ) );
            
            b->next = new_table[j].next;
            new_table[j].next = b;

            b = c;
        }
    }

    /* return old buckets to free list */
    for ( i = 0; i < table->n_buckets - 1; ++i ) {
        table->buckets[i].next = &table->buckets[i+1];
        table->buckets[i].data = NULL;
    } 
    table->buckets[table->n_buckets-1].next = table->free_buckets;
    table->buckets[table->n_buckets-1].data = NULL;
    table->free_buckets = table->buckets;

    /* commit changes */
    table->buckets = new_table;
    table->n_buckets = new_n_buckets;
    table->ghash = new_ghash;
}